

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# advancing_front.cc
# Opt level: O0

Node * __thiscall p2t::AdvancingFront::LocatePoint(AdvancingFront *this,Point *point)

{
  double x;
  double dVar1;
  double nx;
  Node *node;
  double px;
  Point *point_local;
  AdvancingFront *this_local;
  
  x = point->x;
  nx = (double)FindSearchNode(this,x);
  dVar1 = ((Node *)nx)->point->x;
  if ((x != dVar1) || (NAN(x) || NAN(dVar1))) {
    if (dVar1 <= x) {
      do {
        nx = *(double *)((long)nx + 0x10);
        if ((long *)nx == (long *)0x0) break;
      } while (point != *(Point **)nx);
    }
    else {
      do {
        nx = *(double *)((long)nx + 0x18);
        if ((long *)nx == (long *)0x0) break;
      } while (point != *(Point **)nx);
    }
  }
  else if (point != ((Node *)nx)->point) {
    if (point == ((Node *)nx)->prev->point) {
      nx = (double)((Node *)nx)->prev;
    }
    else {
      if (point != ((Node *)nx)->next->point) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/poly2tri/poly2tri/sweep/advancing_front.cc"
                      ,0x55,"Node *p2t::AdvancingFront::LocatePoint(const Point *)");
      }
      nx = (double)((Node *)nx)->next;
    }
  }
  if (nx != 0.0) {
    this->search_node_ = (Node *)nx;
  }
  return (Node *)nx;
}

Assistant:

Node* AdvancingFront::LocatePoint(const Point* point)
{
  const double px = point->x;
  Node* node = FindSearchNode(px);
  const double nx = node->point->x;

  if (px == nx) {
    if (point != node->point) {
      // We might have two nodes with same x value for a short time
      if (point == node->prev->point) {
        node = node->prev;
      } else if (point == node->next->point) {
        node = node->next;
      } else {
        assert(0);
      }
    }
  } else if (px < nx) {
    while ((node = node->prev) != NULL) {
      if (point == node->point) {
        break;
      }
    }
  } else {
    while ((node = node->next) != NULL) {
      if (point == node->point)
        break;
    }
  }
  if(node) search_node_ = node;
  return node;
}